

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

void __thiscall
btSoftBody::appendLink(btSoftBody *this,Node *node0,Node *node1,Material *mat,bool bcheckexist)

{
  int iVar1;
  Link *pLVar2;
  bool bVar3;
  undefined3 in_register_00000081;
  float fVar4;
  btScalar bVar5;
  float fVar6;
  float fVar7;
  
  if ((CONCAT31(in_register_00000081,bcheckexist) != 0) &&
     (bVar3 = checkLink(this,node0,node1), bVar3)) {
    return;
  }
  appendLink(this,-1,mat);
  iVar1 = (this->m_links).m_size;
  pLVar2 = (this->m_links).m_data;
  pLVar2[(long)iVar1 + -1].m_n[0] = node0;
  pLVar2[(long)iVar1 + -1].m_n[1] = node1;
  fVar6 = (node0->m_x).m_floats[0] - (node1->m_x).m_floats[0];
  fVar7 = (node0->m_x).m_floats[1] - (node1->m_x).m_floats[1];
  fVar4 = (node0->m_x).m_floats[2] - (node1->m_x).m_floats[2];
  fVar4 = fVar4 * fVar4 + fVar6 * fVar6 + fVar7 * fVar7;
  if (fVar4 < 0.0) {
    bVar5 = sqrtf(fVar4);
  }
  else {
    bVar5 = SQRT(fVar4);
  }
  pLVar2[(long)iVar1 + -1].m_rl = bVar5;
  this->m_bUpdateRtCst = true;
  return;
}

Assistant:

void			btSoftBody::appendLink(	Node* node0,
									   Node* node1,
									   Material* mat,
									   bool bcheckexist)
{
	if((!bcheckexist)||(!checkLink(node0,node1)))
	{
		appendLink(-1,mat);
		Link&	l=m_links[m_links.size()-1];
		l.m_n[0]		=	node0;
		l.m_n[1]		=	node1;
		l.m_rl			=	(l.m_n[0]->m_x-l.m_n[1]->m_x).length();
		m_bUpdateRtCst=true;
	}
}